

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

QList<QGesture_*> * __thiscall
QHash<QGesture_*,_QGestureRecognizer_*>::keys
          (QList<QGesture_*> *__return_storage_ptr__,QHash<QGesture_*,_QGestureRecognizer_*> *this,
          QGestureRecognizer **value)

{
  byte bVar1;
  Entry *pEVar2;
  ulong uVar3;
  Data *pDVar4;
  ulong uVar5;
  long in_FS_OFFSET;
  QGesture *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QGesture **)0x0;
  (__return_storage_ptr__->d).size = 0;
  pDVar4 = this->d;
  if (pDVar4 == (Data *)0x0) {
    pDVar4 = (Data *)0x0;
  }
  else if (pDVar4->spans->offsets[0] == 0xff) {
    uVar3 = 1;
    do {
      uVar5 = uVar3;
      if (pDVar4->numBuckets == uVar5) {
        pDVar4 = (Data *)0x0;
        uVar5 = 0;
        break;
      }
      uVar3 = uVar5 + 1;
    } while (pDVar4->spans[uVar5 >> 7].offsets[(uint)uVar5 & 0x7f] == 0xff);
    goto LAB_002d8e11;
  }
  uVar5 = 0;
LAB_002d8e11:
  if (uVar5 != 0 || pDVar4 != (Data *)0x0) {
    do {
      pEVar2 = pDVar4->spans[uVar5 >> 7].entries;
      bVar1 = pDVar4->spans[uVar5 >> 7].offsets[(uint)uVar5 & 0x7f];
      if (*(QGestureRecognizer **)(pEVar2[bVar1].storage.data + 8) == *value) {
        local_38 = *(QGesture **)pEVar2[bVar1].storage.data;
        QtPrivate::QPodArrayOps<QGesture*>::emplace<QGesture*&>
                  ((QPodArrayOps<QGesture*> *)__return_storage_ptr__,
                   (__return_storage_ptr__->d).size,&local_38);
        QList<QGesture_*>::end(__return_storage_ptr__);
      }
      do {
        if (pDVar4->numBuckets - 1 == uVar5) {
          uVar5 = 0;
          pDVar4 = (Data *)0x0;
          break;
        }
        uVar5 = uVar5 + 1;
      } while (pDVar4->spans[uVar5 >> 7].offsets[(uint)uVar5 & 0x7f] == 0xff);
    } while (uVar5 != 0 || pDVar4 != (Data *)0x0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QList<Key> keys(const T &value) const
    {
        QList<Key> res;
        const_iterator i = begin();
        while (i != end()) {
            if (i.value() == value)
                res.append(i.key());
            ++i;
        }
        return res;
    }